

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int pk_get_rsapubkey(uchar **p,uchar *end,mbedtls_rsa_context *rsa)

{
  size_t sVar1;
  size_t local_38;
  size_t len;
  mbedtls_rsa_context *pmStack_28;
  int ret;
  mbedtls_rsa_context *rsa_local;
  uchar *end_local;
  uchar **p_local;
  
  pmStack_28 = rsa;
  rsa_local = (mbedtls_rsa_context *)end;
  end_local = (uchar *)p;
  len._4_4_ = mbedtls_asn1_get_tag(p,end,&local_38,0x30);
  if (len._4_4_ == 0) {
    if ((mbedtls_rsa_context *)(*(long *)end_local + local_38) == rsa_local) {
      len._4_4_ = mbedtls_asn1_get_mpi((uchar **)end_local,(uchar *)rsa_local,&pmStack_28->N);
      if ((len._4_4_ == 0) &&
         (len._4_4_ = mbedtls_asn1_get_mpi((uchar **)end_local,(uchar *)rsa_local,&pmStack_28->E),
         len._4_4_ == 0)) {
        if (*(mbedtls_rsa_context **)end_local != rsa_local) {
          return -0x3b66;
        }
        len._4_4_ = mbedtls_rsa_check_pubkey(pmStack_28);
        if (len._4_4_ != 0) {
          return -0x3b00;
        }
        sVar1 = mbedtls_mpi_size(&pmStack_28->N);
        pmStack_28->len = sVar1;
        return 0;
      }
      p_local._4_4_ = len._4_4_ + -0x3b00;
    }
    else {
      p_local._4_4_ = -0x3b66;
    }
  }
  else {
    p_local._4_4_ = len._4_4_ + -0x3b00;
  }
  return p_local._4_4_;
}

Assistant:

static int pk_get_rsapubkey( unsigned char **p,
                             const unsigned char *end,
                             mbedtls_rsa_context *rsa )
{
    int ret;
    size_t len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY + ret );

    if( *p + len != end )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    if( ( ret = mbedtls_asn1_get_mpi( p, end, &rsa->N ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( p, end, &rsa->E ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY + ret );

    if( *p != end )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    if( ( ret = mbedtls_rsa_check_pubkey( rsa ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY );

    rsa->len = mbedtls_mpi_size( &rsa->N );

    return( 0 );
}